

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O0

small_mempool * small_mempool_group_last_pool(small_mempool *first,small_mempool *last)

{
  byte bVar1;
  small_mempool *local_28;
  small_mempool *last_in_group;
  uint8_t pool_count;
  small_mempool *last_local;
  small_mempool *first_local;
  
  last_in_group._7_1_ = 0;
  local_28 = first;
  while( true ) {
    bVar1 = last_in_group._7_1_;
    if (local_28 < last) {
      last_in_group._7_1_ = last_in_group._7_1_ + 1;
    }
    if (local_28 >= last || 0x1e < bVar1) break;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

static inline struct small_mempool*
small_mempool_group_last_pool(struct small_mempool *first,
			      struct small_mempool *last)
{
	uint8_t pool_count = 0;
	struct small_mempool *last_in_group = first;
	while (last_in_group < last && pool_count++ < POOL_PER_GROUP_MAX - 1)
		last_in_group++;
	return last_in_group;
}